

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

char * kj::_::
       fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                 (char *target,ArrayPtr<const_char> *first,ArrayPtr<const_char> *rest,
                 ArrayPtr<const_char> *rest_1,CappedArray<char,_14UL> *rest_2,
                 ArrayPtr<const_char> *rest_3,StringPtr *rest_4,ArrayPtr<const_char> *rest_5,
                 ArrayPtr<const_char> *rest_6,ArrayPtr<const_char> *rest_7,
                 ArrayPtr<const_char> *rest_8,ArrayPtr<const_char> *rest_9)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  sVar1 = first->size_;
  if (sVar1 != 0) {
    pcVar2 = first->ptr;
    sVar3 = 0;
    do {
      target[sVar3] = pcVar2[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
    target = target + sVar3;
  }
  sVar1 = rest->size_;
  if (sVar1 != 0) {
    pcVar2 = rest->ptr;
    sVar3 = 0;
    do {
      target[sVar3] = pcVar2[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
    target = target + sVar3;
  }
  pcVar2 = fill<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringPtr,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
                     (target,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,rest_9);
  return pcVar2;
}

Assistant:

char* fill(char* __restrict__ target, const First& first, Rest&&... rest) {
  auto i = first.begin();
  auto end = first.end();
  while (i != end) {
    *target++ = *i++;
  }
  return fill(target, kj::fwd<Rest>(rest)...);
}